

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>::
GetPropertyReferenceQuery
          (CrossSiteObject<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_> *this,
          Var originalInstance,PropertyId propertyId,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var pvVar2;
  PropertyQueryFlags result;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var originalInstance_local;
  CrossSiteObject<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pvVar2 = CrossSite::MarshalVar(scriptContext,originalInstance,false);
  val = JavascriptFunction::GetPropertyReferenceQuery
                  ((JavascriptFunction *)this,pvVar2,propertyId,value,info,requestContext);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  if (BVar1 != 0) {
    pvVar2 = CrossSite::MarshalVar(requestContext,*value,false);
    *value = pvVar2;
  }
  return val;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetPropertyReferenceQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetPropertyReferenceQuery(originalInstance, propertyId, value, info, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }